

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::ProfiledNewScObject_Helper
          (InterpreterStackFrame *this,Var target,ArgSlot ArgCount,ProfileId profileId,
          InlineCacheIndex inlineCacheIndex,AuxArray<unsigned_int> *spreadIndices)

{
  undefined1 uVar1;
  long lVar2;
  bool bVar3;
  Var obj;
  RecyclableObject *value;
  undefined6 in_register_00000012;
  Arguments local_40;
  
  local_40.Info = (Type)(CONCAT62(in_register_00000012,ArgCount) & 0xffffffff | 0x1000000);
  local_40.Values = *(Type *)(this + 0x28);
  lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  uVar1 = *(undefined1 *)(lVar2 + 0x109);
  *(undefined1 *)(lVar2 + 0x109) = 1;
  obj = ProfilingHelpers::ProfiledNewScObject
                  (target,&local_40,*(FunctionBody **)(this + 0x88),profileId,inlineCacheIndex,
                   spreadIndices);
  *(undefined1 *)(lVar2 + 0x109) = uVar1;
  PopOut(this,ArgCount);
  bVar3 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar3) {
    value = JavascriptProxy::AutoProxyWrapper(obj);
    obj = CrossSite::MarshalVar(*(ScriptContext **)(this + 0x78),value,false);
  }
  return obj;
}

Assistant:

Var InterpreterStackFrame::ProfiledNewScObject_Helper(Var target, ArgSlot ArgCount, ProfileId profileId, InlineCacheIndex inlineCacheIndex, const Js::AuxArray<uint32> *spreadIndices)
    {
        Arguments args(CallInfo(CallFlags_New, ArgCount), m_outParams);

        Var newVarInstance = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(this->scriptContext->GetThreadContext())
        {
            newVarInstance = ProfilingHelpers::ProfiledNewScObject(
                target,
                args,
                GetFunctionBody(),
                profileId,
                inlineCacheIndex,
                spreadIndices);
        }
        END_SAFE_REENTRANT_CALL

        PopOut(ArgCount);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newVarInstance));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newVarInstance = JavascriptProxy::AutoProxyWrapper(newVarInstance);
            // this might come from a different scriptcontext.
            newVarInstance = CrossSite::MarshalVar(GetScriptContext(), newVarInstance);
        }
#endif
#ifdef TELEMETRY_PROFILED
        {
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().NewScriptObject(target, args, newVarInstance);
        }
#endif
        return newVarInstance;
    }